

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_type.cpp
# Opt level: O2

pair<bool,_node_type> string_to_node(string *string)

{
  pair<bool,_node_type> pVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  long lVar5;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>
  __l;
  allocator_type local_237;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_236;
  node_type local_235 [13];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_200;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_1d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_48;
  
  if (string_to_node(std::__cxx11::string)::table_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&string_to_node(std::__cxx11::string)::table_abi_cxx11_);
    if (iVar2 != 0) {
      local_235[0xc] = 1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[2],_node_type,_true>(&local_228,(char (*) [2])"D",local_235 + 0xc);
      local_235[0xb] = 2;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_200,(char (*) [3])"P0",local_235 + 0xb);
      local_235[10] = 3;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_1d8,(char (*) [3])"I1",local_235 + 10);
      local_235[9] = 4;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_1b0,(char (*) [3])"P1",local_235 + 9);
      local_235[8] = 5;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_188,(char (*) [3])"I2",local_235 + 8);
      local_235[7] = 6;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_160,(char (*) [3])"P2",local_235 + 7);
      local_235[6] = 7;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_138,(char (*) [3])"I3",local_235 + 6);
      local_235[5] = 8;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_110,(char (*) [3])"P3",local_235 + 5);
      local_235[4] = 9;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_e8,(char (*) [3])"I4",local_235 + 4);
      local_235[3] = 10;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_c0,(char (*) [3])"P4",local_235 + 3);
      local_235[2] = 0xb;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_98,(char (*) [3])"P5",local_235 + 2);
      local_235[1] = 0xc;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_70,(char (*) [3])"P6",local_235 + 1);
      local_235[0] = P7;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_48,(char (*) [3])"P7",local_235);
      __l._M_len = 0xd;
      __l._M_array = &local_228;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>_>
      ::map(&string_to_node(std::__cxx11::string)::table_abi_cxx11_,__l,&local_236,&local_237);
      lVar5 = 0x1e0;
      do {
        std::__cxx11::string::~string((string *)((long)&local_228.first._M_dataplus._M_p + lVar5));
        lVar5 = lVar5 + -0x28;
      } while (lVar5 != -0x28);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>_>
                   ::~map,&string_to_node(std::__cxx11::string)::table_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&string_to_node(std::__cxx11::string)::table_abi_cxx11_);
    }
  }
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>_>
          ::find(&string_to_node(std::__cxx11::string)::table_abi_cxx11_._M_t,string);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &string_to_node(std::__cxx11::string)::table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    pVar1.first = false;
    pVar1.second = 0;
  }
  else {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>_>
             ::operator[](&string_to_node(std::__cxx11::string)::table_abi_cxx11_,string);
    pVar1 = (pair<bool,_node_type>)((ushort)*pmVar4 * 0x100 + 1);
  }
  return pVar1;
}

Assistant:

std::pair<bool, node_type> string_to_node(std::string string)
{
    static std::map<std::string, node_type> table = {
        {"D", D},
        {"P0", P0},
        {"I1", I1},
        {"P1", P1},
        {"I2", I2},
        {"P2", P2},
        {"I3", I3},
        {"P3", P3},
        {"I4", I4},
        {"P4", P4},
        {"P5", P5},
        {"P6", P6},
        {"P7", P7},
    };

    std::pair<bool, node_type> pair;
    if(table.find(string) == table.end())
    {
        pair.first = false;
    }
    else
    {
        pair.first = true;
        pair.second = table[string];
    }
    
    return pair;
}